

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void kj::printStackTraceOnCrash(void)

{
  int iVar1;
  Fault f_1;
  Fault f;
  undefined1 local_b8 [128];
  int local_38;
  sigaltstack local_28;
  
  local_28.ss_flags = 0;
  local_28._12_4_ = 0;
  local_28.ss_size = 0x10000;
  local_28.ss_sp = mmap((void *)0x0,0x10000,3,0x122,-1,0);
  do {
    iVar1 = sigaltstack(&local_28,(sigaltstack *)0x0);
    if (-1 < iVar1) goto LAB_001770f6;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
               ,0x1f6,iVar1,"sigaltstack(&stack, nullptr)","");
    _::Debug::Fault::fatal(&f);
  }
LAB_001770f6:
  memset(local_b8,0,0x90);
  local_38 = -0x37fffffc;
  f.exception = (Exception *)anon_unknown_52::crashHandler;
  do {
    iVar1 = sigaction(0xb,(sigaction *)&f,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_0017714b;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f_1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
               ,0x200,iVar1,"sigaction(SIGSEGV, &action, nullptr)","");
    _::Debug::Fault::fatal(&f_1);
  }
LAB_0017714b:
  do {
    iVar1 = sigaction(7,(sigaction *)&f,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_00177172;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f_1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
               ,0x201,iVar1,"sigaction(SIGBUS, &action, nullptr)","");
    _::Debug::Fault::fatal(&f_1);
  }
LAB_00177172:
  do {
    iVar1 = sigaction(8,(sigaction *)&f,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_00177199;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f_1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
               ,0x202,iVar1,"sigaction(SIGFPE, &action, nullptr)","");
    _::Debug::Fault::fatal(&f_1);
  }
LAB_00177199:
  do {
    iVar1 = sigaction(6,(sigaction *)&f,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_001771c0;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f_1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
               ,0x203,iVar1,"sigaction(SIGABRT, &action, nullptr)","");
    _::Debug::Fault::fatal(&f_1);
  }
LAB_001771c0:
  do {
    iVar1 = sigaction(4,(sigaction *)&f,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_001771e7;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              (&f_1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
               ,0x204,iVar1,"sigaction(SIGILL, &action, nullptr)","");
    _::Debug::Fault::fatal(&f_1);
  }
LAB_001771e7:
  do {
    iVar1 = sigaction(0x1f,(sigaction *)&f,(sigaction *)0x0);
    if (-1 < iVar1) {
      return;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return;
  }
  _::Debug::Fault::Fault
            (&f_1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
             ,0x207,iVar1,"sigaction(SIGSYS, &action, nullptr)","");
  _::Debug::Fault::fatal(&f_1);
}

Assistant:

void printStackTraceOnCrash() {
  // Set up alternate signal stack so that stack overflows can be handled.
  stack_t stack;
  memset(&stack, 0, sizeof(stack));

#ifndef MAP_ANONYMOUS
#define MAP_ANONYMOUS MAP_ANON
#endif
#ifndef MAP_GROWSDOWN
#define MAP_GROWSDOWN 0
#endif

  stack.ss_size = 65536;
  // Note: ss_sp is char* on FreeBSD, void* on Linux and OSX.
  stack.ss_sp = reinterpret_cast<char*>(mmap(
      nullptr, stack.ss_size, PROT_READ | PROT_WRITE,
      MAP_ANONYMOUS | MAP_PRIVATE | MAP_GROWSDOWN, -1, 0));
  KJ_SYSCALL(sigaltstack(&stack, nullptr));

  // Catch all relevant signals.
  struct sigaction action;
  memset(&action, 0, sizeof(action));

  action.sa_flags = SA_SIGINFO | SA_ONSTACK | SA_NODEFER | SA_RESETHAND;
  action.sa_sigaction = &crashHandler;

  // Dump stack on common "crash" signals.
  KJ_SYSCALL(sigaction(SIGSEGV, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGBUS, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGFPE, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGABRT, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGILL, &action, nullptr));

  // Dump stack on unimplemented syscalls -- useful in seccomp sandboxes.
  KJ_SYSCALL(sigaction(SIGSYS, &action, nullptr));

#ifdef KJ_DEBUG
  // Dump stack on keyboard interrupt -- useful for infinite loops. Only in debug mode, though,
  // because stack traces on ctrl+c can be obnoxious for, say, command-line tools.
  KJ_SYSCALL(sigaction(SIGINT, &action, nullptr));
#endif
}